

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O1

void __thiscall adios2::profiling::IOChrono::Start(IOChrono *this,string *process)

{
  pointer pcVar1;
  iterator iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  mapped_type *this_00;
  string local_d0;
  Timer local_b0;
  
  if (this->m_IsActive == true) {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,process);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
        ._M_cur != (__node_type *)0x0) {
      Timer::Resume((Timer *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                                    ._M_cur + 0x28));
      return;
    }
    uVar3 = std::__throw_out_of_range("_Map_base::at");
    __cxa_begin_catch(uVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Adding timer \"",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(process->_M_dataplus)._M_p,process->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" didn\'t exist.",0xf);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (process->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + process->_M_string_length);
    Timer::Timer(&local_b0,&local_d0,Microseconds,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this,process,&local_b0);
    Timer::~Timer(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
              ::at(&this->m_Timers,process);
    Timer::Resume(this_00);
    __cxa_end_catch();
  }
  return;
}

Assistant:

void IOChrono::Start(const std::string process) noexcept
{
    if (m_IsActive)
    {
        try
        {
            m_Timers.at(process).Resume();
        }
        catch (...)
        {
            std::cout << "Adding timer \"" << process << "\" didn't exist." << std::endl;
            m_Timers.emplace(process, profiling::Timer(process, DefaultTimeUnitEnum, false));
            m_Timers.at(process).Resume();
        }
    }
}